

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::VisitLink
          (cmGraphVizWriter *this,cmLinkItem *depender,cmLinkItem *dependee,bool isDirectLink,
          string *scopeType)

{
  bool bVar1;
  vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>> *pvVar2;
  
  bVar1 = ItemExcluded(this,depender);
  if (!bVar1) {
    bVar1 = ItemExcluded(this,dependee);
    if (isDirectLink && !bVar1) {
      WriteConnection(this,&this->GlobalFileStream,depender,dependee,scopeType);
      if (this->GeneratePerTarget == true) {
        pvVar2 = (vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>
                  *)std::
                    map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                    ::operator[](&this->PerTargetConnections,depender);
        std::vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>::
        emplace_back<cmLinkItem_const&,cmLinkItem_const&,std::__cxx11::string_const&>
                  (pvVar2,depender,dependee,scopeType);
      }
      if (this->GenerateDependers == true) {
        pvVar2 = (vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>
                  *)std::
                    map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                    ::operator[](&this->TargetDependersConnections,dependee);
        std::vector<cmGraphVizWriter::Connection,std::allocator<cmGraphVizWriter::Connection>>::
        emplace_back<cmLinkItem_const&,cmLinkItem_const&,std::__cxx11::string_const&>
                  (pvVar2,dependee,depender,scopeType);
        return;
      }
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::VisitLink(cmLinkItem const& depender,
                                 cmLinkItem const& dependee, bool isDirectLink,
                                 std::string const& scopeType)
{
  if (this->ItemExcluded(depender) || this->ItemExcluded(dependee)) {
    return;
  }

  if (!isDirectLink) {
    return;
  }

  // write global data directly
  this->WriteConnection(this->GlobalFileStream, depender, dependee, scopeType);

  if (this->GeneratePerTarget) {
    this->PerTargetConnections[depender].emplace_back(depender, dependee,
                                                      scopeType);
  }

  if (this->GenerateDependers) {
    this->TargetDependersConnections[dependee].emplace_back(dependee, depender,
                                                            scopeType);
  }
}